

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxTypeCheck::EmitCommon(FxTypeCheck *this,VMFunctionBuilder *build)

{
  uint uVar1;
  ExpEmit EVar2;
  ExpEmit EVar3;
  ExpEmit EVar4;
  ExpEmit casttype;
  ExpEmit castee;
  undefined4 extraout_var;
  uint extraout_var_00;
  
  EVar2._0_4_ = (*this->left->_vptr_FxExpression[9])();
  EVar2.Konst = (bool)(char)extraout_var;
  EVar2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  castee = EVar2;
  EVar3._0_4_ = (*this->right->_vptr_FxExpression[9])(this->right,build);
  EVar3.Konst = (bool)(char)extraout_var_00;
  EVar3.Fixed = (bool)(char)(extraout_var_00 >> 8);
  EVar3.Final = (bool)(char)(extraout_var_00 >> 0x10);
  EVar3.Target = (bool)(char)(extraout_var_00 >> 0x18);
  casttype = EVar3;
  ExpEmit::Free(&castee,build);
  ExpEmit::Free(&casttype,build);
  uVar1 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
  VMFunctionBuilder::Emit
            (build,((extraout_var_00 & 1) != 0) + 0x40,uVar1 & 0xffff,EVar2._0_4_ & 0xffff,
             EVar3._0_4_ & 0xffff);
  EVar4._0_4_ = uVar1 & 0xffff | 0x1030000;
  EVar4.Konst = false;
  EVar4.Fixed = false;
  EVar4.Final = false;
  EVar4.Target = false;
  return EVar4;
}

Assistant:

ExpEmit FxTypeCheck::EmitCommon(VMFunctionBuilder *build)
{
	ExpEmit castee = left->Emit(build);
	ExpEmit casttype = right->Emit(build);
	castee.Free(build);
	casttype.Free(build);
	ExpEmit ares(build, REGT_POINTER);
	build->Emit(casttype.Konst ? OP_DYNCAST_K : OP_DYNCAST_R, ares.RegNum, castee.RegNum, casttype.RegNum);
	return ares;
}